

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexInternalShape.cpp
# Opt level: O2

btVector3 __thiscall
btConvexInternalShape::localGetSupportingVertex(btConvexInternalShape *this,btVector3 *vec)

{
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  btScalar bVar1;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Db;
  float in_XMM1_Da;
  undefined4 in_XMM1_Db;
  float fVar2;
  float fVar3;
  btVector3 bVar4;
  btVector3 local_28;
  
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0x11])();
  (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  if ((extraout_XMM0_Da_00 != 0.0) ||
     (fVar2 = extraout_XMM0_Da, fVar3 = extraout_XMM0_Db, NAN(extraout_XMM0_Da_00))) {
    local_28.m_floats._0_8_ = *(undefined8 *)vec->m_floats;
    local_28.m_floats._8_8_ = *(undefined8 *)(vec->m_floats + 2);
    bVar1 = btVector3::length2(&local_28);
    if (bVar1 < 1.4210855e-14) {
      local_28.m_floats[0] = -1.0;
      local_28.m_floats[1] = -1.0;
      local_28.m_floats[2] = -1.0;
      local_28.m_floats[3] = 0.0;
    }
    btVector3::normalize(&local_28);
    (*(this->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
    fVar2 = extraout_XMM0_Da + extraout_XMM0_Da_01 * local_28.m_floats[0];
    fVar3 = extraout_XMM0_Db + extraout_XMM0_Da_01 * local_28.m_floats[1];
    in_XMM1_Da = in_XMM1_Da + local_28.m_floats[2] * extraout_XMM0_Da_01;
  }
  bVar4.m_floats[1] = fVar3;
  bVar4.m_floats[0] = fVar2;
  bVar4.m_floats[3] = (btScalar)in_XMM1_Db;
  bVar4.m_floats[2] = in_XMM1_Da;
  return (btVector3)bVar4.m_floats;
}

Assistant:

btVector3	btConvexInternalShape::localGetSupportingVertex(const btVector3& vec)const
{
#ifndef __SPU__

	 btVector3	supVertex = localGetSupportingVertexWithoutMargin(vec);

	if ( getMargin()!=btScalar(0.) )
	{
		btVector3 vecnorm = vec;
		if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
		{
			vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
		} 
		vecnorm.normalize();
		supVertex+= getMargin() * vecnorm;
	}
	return supVertex;

#else
	btAssert(0);
	return btVector3(0,0,0);
#endif //__SPU__

 }